

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QLinuxFbDevice::Output>::emplace<QLinuxFbDevice::Output_const&>
          (QGenericArrayOps<QLinuxFbDevice::Output> *this,qsizetype i,Output *args)

{
  Output **ppOVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_1f0;
  Output tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size == i) {
      qVar5 = QArrayDataPointer<QLinuxFbDevice::Output>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QLinuxFbDevice::Output>);
      if (qVar5 == 0) goto LAB_00117c2e;
      QLinuxFbDevice::Output::Output
                ((this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr +
                 (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size,args);
LAB_00117d52:
      pqVar2 = &(this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00117d04;
    }
LAB_00117c2e:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QLinuxFbDevice::Output>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QLinuxFbDevice::Output>);
      if (qVar5 != 0) {
        QLinuxFbDevice::Output::Output
                  ((this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr + -1,args);
        ppOVar1 = &(this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
        *ppOVar1 = *ppOVar1 + -1;
        goto LAB_00117d52;
      }
    }
  }
  memcpy(&tmp,&DAT_00139738,0x170);
  QLinuxFbDevice::Output::Output(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size != 0;
  QArrayDataPointer<QLinuxFbDevice::Output>::detachAndGrow
            (&this->super_QArrayDataPointer<QLinuxFbDevice::Output>,(uint)(i == 0 && bVar6),1,
             (Output **)0x0,(QArrayDataPointer<QLinuxFbDevice::Output> *)0x0);
  if (i == 0 && bVar6) {
    QLinuxFbDevice::Output::Output
              ((this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr + -1,&tmp);
    ppOVar1 = &(this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
    *ppOVar1 = *ppOVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_1f0.sourceCopyConstruct = 0;
    local_1f0.nSource = 0;
    local_1f0.move = 0;
    local_1f0.sourceCopyAssign = 0;
    local_1f0.end = (Output *)0x0;
    local_1f0.last = (Output *)0x0;
    local_1f0.where = (Output *)0x0;
    local_1f0.begin = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
    local_1f0.size = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size;
    local_1f0.data = &this->super_QArrayDataPointer<QLinuxFbDevice::Output>;
    Inserter::insertOne(&local_1f0,i,&tmp);
    (local_1f0.data)->ptr = local_1f0.begin;
    (local_1f0.data)->size = local_1f0.size;
  }
  QLinuxFbDevice::Output::~Output(&tmp);
LAB_00117d04:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }